

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chatwindow.cpp
# Opt level: O0

void __thiscall ChatWindow::messageReceived(ChatWindow *this,QString *sender,QString *text)

{
  QStandardItemModel *pQVar1;
  int iVar2;
  QString *s1;
  bool bVar3;
  Int IVar4;
  Int local_24c;
  QVariant local_248 [32];
  QModelIndex local_228;
  undefined1 local_210 [24];
  QVariant local_1f8 [32];
  QModelIndex local_1d8;
  undefined1 local_1c0 [24];
  QModelIndex local_1a8;
  QFont local_190 [32];
  QModelIndex local_170;
  undefined1 local_158 [28];
  Int local_13c;
  QVariant local_138 [32];
  QModelIndex local_118;
  undefined1 local_100 [29];
  QLatin1Char local_e3;
  QChar local_e2;
  QString local_e0;
  QVariant local_c8 [32];
  QModelIndex local_a8;
  undefined1 local_90 [24];
  QModelIndex local_78;
  QFont local_50 [8];
  QFont boldFont;
  QModelIndex local_40;
  int local_24;
  QString *pQStack_20;
  int newRow;
  QString *text_local;
  QString *sender_local;
  ChatWindow *this_local;
  
  pQVar1 = this->m_chatModel;
  pQStack_20 = text;
  text_local = sender;
  sender_local = (QString *)this;
  QModelIndex::QModelIndex(&local_40);
  local_24 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,&local_40);
  bVar3 = operator!=(&this->m_lastUserName,text_local);
  iVar2 = local_24;
  if (bVar3) {
    QString::operator=(&this->m_lastUserName,(QString *)text_local);
    QFont::QFont(local_50);
    QFont::setBold(local_50,true);
    iVar2 = local_24;
    pQVar1 = this->m_chatModel;
    QModelIndex::QModelIndex(&local_78);
    (**(code **)(*(long *)pQVar1 + 0xf8))(pQVar1,iVar2,2,&local_78);
    iVar2 = local_24;
    pQVar1 = this->m_chatModel;
    QModelIndex::QModelIndex(&local_a8);
    (**(code **)(*(long *)pQVar1 + 0x60))(local_90,pQVar1,iVar2,0,&local_a8);
    s1 = text_local;
    QLatin1Char::QLatin1Char(&local_e3,':');
    QChar::QChar(&local_e2,local_e3);
    operator+(&local_e0,s1,local_e2);
    QVariant::QVariant(local_c8,(QString *)&local_e0);
    (**(code **)(*(long *)pQVar1 + 0x98))(pQVar1,local_90,local_c8,2);
    QVariant::~QVariant(local_c8);
    QString::~QString(&local_e0);
    iVar2 = local_24;
    pQVar1 = this->m_chatModel;
    QModelIndex::QModelIndex(&local_118);
    (**(code **)(*(long *)pQVar1 + 0x60))(local_100,pQVar1,iVar2,0,&local_118);
    local_13c = (Int)Qt::operator|(AlignLeading,AlignVCenter);
    IVar4 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_13c);
    QVariant::QVariant(local_138,IVar4);
    (**(code **)(*(long *)pQVar1 + 0x98))(pQVar1,local_100,local_138,7);
    QVariant::~QVariant(local_138);
    iVar2 = local_24;
    pQVar1 = this->m_chatModel;
    QModelIndex::QModelIndex(&local_170);
    (**(code **)(*(long *)pQVar1 + 0x60))(local_158,pQVar1,iVar2,0,&local_170);
    QFont::operator_cast_to_QVariant(local_190);
    (**(code **)(*(long *)pQVar1 + 0x98))(pQVar1,local_158,local_190,6);
    QVariant::~QVariant((QVariant *)local_190);
    local_24 = local_24 + 1;
    QFont::~QFont(local_50);
  }
  else {
    pQVar1 = this->m_chatModel;
    QModelIndex::QModelIndex(&local_1a8);
    QStandardItemModel::insertRow(pQVar1,iVar2,&local_1a8);
  }
  iVar2 = local_24;
  pQVar1 = this->m_chatModel;
  QModelIndex::QModelIndex(&local_1d8);
  (**(code **)(*(long *)pQVar1 + 0x60))(local_1c0,pQVar1,iVar2,0,&local_1d8);
  QVariant::QVariant(local_1f8,(QString *)pQStack_20);
  (**(code **)(*(long *)pQVar1 + 0x98))(pQVar1,local_1c0,local_1f8,2);
  QVariant::~QVariant(local_1f8);
  iVar2 = local_24;
  pQVar1 = this->m_chatModel;
  QModelIndex::QModelIndex(&local_228);
  (**(code **)(*(long *)pQVar1 + 0x60))(local_210,pQVar1,iVar2,0,&local_228);
  local_24c = (Int)Qt::operator|(AlignLeading,AlignVCenter);
  IVar4 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_24c);
  QVariant::QVariant(local_248,IVar4);
  (**(code **)(*(long *)pQVar1 + 0x98))(pQVar1,local_210,local_248,7);
  QVariant::~QVariant(local_248);
  QAbstractItemView::scrollToBottom();
  return;
}

Assistant:

void ChatWindow::messageReceived(const QString &sender, const QString &text)
{
    // store the index of the new row to append to the model containing the messages
    int newRow = m_chatModel->rowCount();
    // we display a line containing the username only if it's different from the last username we displayed
    if (m_lastUserName != sender) {
        // store the last displayed username
        m_lastUserName = sender;
        // create a bold default font
        QFont boldFont;
        boldFont.setBold(true);
        // insert 2 row, one for the message and one for the username
        m_chatModel->insertRows(newRow, 2);
        // store the username in the model
        m_chatModel->setData(m_chatModel->index(newRow, 0), sender + QLatin1Char(':'));
        // set the alignment for the username
        m_chatModel->setData(m_chatModel->index(newRow, 0), int(Qt::AlignLeft | Qt::AlignVCenter), Qt::TextAlignmentRole);
        // set the for the username
        m_chatModel->setData(m_chatModel->index(newRow, 0), boldFont, Qt::FontRole);
        ++newRow;
    } else {
        // insert a row for the message
        m_chatModel->insertRow(newRow);
    }
    // store the message in the model
    m_chatModel->setData(m_chatModel->index(newRow, 0), text);
    // set the alignment for the message
    m_chatModel->setData(m_chatModel->index(newRow, 0), int(Qt::AlignLeft | Qt::AlignVCenter), Qt::TextAlignmentRole);
    // scroll the view to display the new message
    ui->chatView->scrollToBottom();
}